

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void __thiscall TestMaterial::RandomTestSupportFunctionAllObjects(TestMaterial *this)

{
  undefined8 *puVar1;
  double *pdVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  time_t tVar9;
  clock_t cVar10;
  long lVar11;
  clock_t cVar12;
  long lVar13;
  long lVar14;
  size_t i;
  ulong uVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_> v
  ;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  supportVector;
  
  poVar8 = std::operator<<((ostream *)&std::cout,"RandomTestSupportFunctionAllObjects");
  std::endl<char,std::char_traits<char>>(poVar8);
  std::
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>::
  vector(&supportVector,
         ((ulong)(*(long *)&this->field_0x10 - *(long *)&this->field_0x8) >> 3) * 1000000,
         (allocator_type *)&v);
  tVar9 = time((time_t *)0x0);
  srand((uint)tVar9);
  std::
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>::
  vector(&v,1000000,(allocator_type *)&local_60);
  for (lVar13 = 0x10; lVar13 != 0x16e3610; lVar13 = lVar13 + 0x18) {
    iVar4 = rand();
    iVar5 = rand();
    iVar6 = rand();
    iVar7 = rand();
    dVar17 = log((double)iVar4 / 2147483647.0);
    dVar17 = dVar17 * -2.0;
    if (dVar17 < 0.0) {
      dVar17 = sqrt(dVar17);
    }
    else {
      dVar17 = SQRT(dVar17);
    }
    dVar18 = cos(((double)iVar5 / 2147483647.0) * 6.283185307179586);
    dVar19 = log((double)iVar5 / 2147483647.0);
    dVar19 = dVar19 * -2.0;
    if (dVar19 < 0.0) {
      dVar19 = sqrt(dVar19);
    }
    else {
      dVar19 = SQRT(dVar19);
    }
    dVar20 = cos(((double)iVar4 / 2147483647.0) * 6.283185307179586);
    dVar21 = log((double)iVar6 / 2147483647.0);
    dVar21 = dVar21 * -2.0;
    if (dVar21 < 0.0) {
      dVar21 = sqrt(dVar21);
    }
    else {
      dVar21 = SQRT(dVar21);
    }
    dVar22 = cos(((double)iVar7 / 2147483647.0) * 6.283185307179586);
    pdVar2 = (double *)
             ((long)v.
                    super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar13 + -0x10);
    *pdVar2 = dVar18 * dVar17;
    pdVar2[1] = dVar20 * dVar19;
    *(double *)
     ((long)&(v.
              super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->m_x + lVar13) = dVar22 * dVar21;
  }
  lVar14 = 0;
  cVar10 = clock();
  for (lVar13 = 0; lVar13 != 1000000; lVar13 = lVar13 + 1) {
    lVar16 = 0;
    uVar15 = 0;
    while( true ) {
      if ((ulong)(*(long *)&this->field_0x10 - *(long *)&this->field_0x8 >> 3) <= uVar15) break;
      plVar3 = *(long **)(*(long *)&this->field_0x8 + uVar15 * 8);
      (**(code **)(*plVar3 + 0x20))
                (&local_60,plVar3,
                 v.
                 super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar13);
      lVar11 = (*(long *)&this->field_0x10 - *(long *)&this->field_0x8 >> 3) * lVar14;
      *(undefined8 *)
       ((long)&(supportVector.
                super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->m_z + lVar16 + lVar11) = local_50;
      puVar1 = (undefined8 *)
               ((long)&(supportVector.
                        super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_x + lVar16 + lVar11);
      *puVar1 = local_60;
      puVar1[1] = uStack_58;
      uVar15 = uVar15 + 1;
      lVar16 = lVar16 + 0x18;
    }
    lVar14 = lVar14 + 0x18;
  }
  cVar12 = clock();
  std::operator<<((ostream *)&std::cout,"  computation time: ");
  poVar8 = std::ostream::_M_insert<double>((double)(cVar12 - cVar10) / 1000000.0);
  std::endl<char,std::char_traits<char>>(poVar8);
  std::
  _Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  ::~_Vector_base(&v.
                   super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                 );
  std::
  _Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  ::~_Vector_base(&supportVector.
                   super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                 );
  return;
}

Assistant:

void TestMaterial::RandomTestSupportFunctionAllObjects()
{
  std::cout << "RandomTestSupportFunctionAllObjects" << std::endl;
  std::vector<Vector3> supportVector(RandomTestEnd * sObj.size());

  srand(static_cast<unsigned int>(time(NULL)));
  clock_t begin, end;

  std::vector<Vector3> v(RandomTestEnd);

  for (long j=0; j<RandomTestEnd; j++)
  {
    double a = (rand()/double(RAND_MAX)) ;
    double b = (rand()/double(RAND_MAX)) ;
    double c = (rand()/double(RAND_MAX)) ;
    double d = (rand()/double(RAND_MAX)) ;

    v[j]=Vector3(sqrt(-2*log(a))*cos(2*PI*b),sqrt(-2*log(b))*cos(2*PI*a),sqrt(-2*log(c))*cos(2*PI*d));
  }

  begin=clock();
  for (long j=0; j<RandomTestEnd; j++)
  {
#ifdef DO_TEST
    for(size_t i=0; i<sObj.size(); i++)
      supportVector[j*sObj.size() + i] = sObj[i]->support(v[j]);
#endif
  }

  end=clock();

  std::cout << "  computation time: " << ((double)(end- begin) / CLOCKS_PER_SEC) <<  std::endl;

#ifdef DO_TEST
# ifdef OUTPUT_FILE
  std::fstream outfile;
  outfile.open("/tmp/sch_randomtestsupportall_result.txt",std::ios_base::out|std::ios_base::trunc);
  outfile.precision(18);
  for(size_t i=0; i<supportVector.size(); ++i)
    outfile << supportVector[i] << std::endl;
  outfile.close();
# endif
#endif
}